

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixTone.cpp
# Opt level: O0

BOOL MakePixelWaveData(PIXTONEPARAMETER *ptp,uchar *pData)

{
  int iVar1;
  double dVar2;
  double local_170;
  double d3;
  double d2;
  double d1;
  char envelopeTable [256];
  double local_50;
  double dEnvelope;
  double dVolume;
  double dMain;
  double dPitch;
  int d;
  int c;
  int b;
  int a;
  int i;
  uchar *pData_local;
  PIXTONEPARAMETER *ptp_local;
  
  MakeWaveTables();
  memset(&d1,0,0x100);
  b = 0;
  local_50 = (double)ptp->initial;
  for (; b < ptp->pointAx; b = b + 1) {
    envelopeTable[(long)b + -8] = (char)(int)local_50;
    local_50 = ((double)ptp->pointAy - (double)ptp->initial) / (double)ptp->pointAx + local_50;
  }
  local_50 = (double)ptp->pointAy;
  for (; b < ptp->pointBx; b = b + 1) {
    envelopeTable[(long)b + -8] = (char)(int)local_50;
    local_50 = ((double)ptp->pointBy - (double)ptp->pointAy) / (double)(ptp->pointBx - ptp->pointAx)
               + local_50;
  }
  local_50 = (double)ptp->pointBy;
  for (; b < ptp->pointCx; b = b + 1) {
    envelopeTable[(long)b + -8] = (char)(int)local_50;
    local_50 = ((double)ptp->pointCy - (double)ptp->pointBy) / (double)(ptp->pointCx - ptp->pointBx)
               + local_50;
  }
  local_50 = (double)ptp->pointCy;
  for (; b < 0x100; b = b + 1) {
    envelopeTable[(long)b + -8] = (char)(int)local_50;
    local_50 = local_50 - (double)ptp->pointCy / (double)(0x100 - ptp->pointCx);
  }
  dMain = (double)(ptp->oPitch).offset;
  dVolume = (double)(ptp->oMain).offset;
  dEnvelope = (double)(ptp->oVolume).offset;
  dVar2 = (ptp->oMain).num;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    d2 = 256.0 / ((double)ptp->size / (ptp->oMain).num);
  }
  else {
    d2 = 0.0;
  }
  dVar2 = (ptp->oPitch).num;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    d3 = 256.0 / ((double)ptp->size / (ptp->oPitch).num);
  }
  else {
    d3 = 0.0;
  }
  dVar2 = (ptp->oVolume).num;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    local_170 = 256.0 / ((double)ptp->size / (ptp->oVolume).num);
  }
  else {
    local_170 = 0.0;
  }
  for (b = 0; b < ptp->size; b = b + 1) {
    iVar1 = (int)dMain % 0x100;
    pData[b] = (char)(((((((int)gWaveModelTable[(ptp->oMain).model][(int)dVolume % 0x100] *
                          (ptp->oMain).top) / 0x40) *
                        (((int)gWaveModelTable[(ptp->oVolume).model][(int)dEnvelope % 0x100] *
                         (ptp->oVolume).top) / 0x40 + 0x40)) / 0x40) *
                      (int)envelopeTable[(long)(int)((double)(b << 8) / (double)ptp->size) + -8]) /
                     0x40) + 0x80;
    if (gWaveModelTable[(ptp->oPitch).model][iVar1] < '\0') {
      dVar2 = d2 - ((d2 * 0.5 * (double)-(int)gWaveModelTable[(ptp->oPitch).model][iVar1] *
                    (double)(ptp->oPitch).top) / 64.0) / 64.0;
    }
    else {
      dVar2 = d2 + ((d2 * 2.0 * (double)(int)gWaveModelTable[(ptp->oPitch).model][iVar1] *
                    (double)(ptp->oPitch).top) / 64.0) / 64.0;
    }
    dVolume = dVar2 + dVolume;
    dMain = dMain + d3;
    dEnvelope = dEnvelope + local_170;
  }
  return true;
}

Assistant:

BOOL MakePixelWaveData(const PIXTONEPARAMETER *ptp, unsigned char *pData)
{
	int i;
	int a, b, c, d;

	double dPitch;
	double dMain;
	double dVolume;

	double dEnvelope;
	signed char envelopeTable[0x100];

	double d1, d2, d3;

	// The Linux port added a cute optimisation here, where MakeWaveTables is only called once during the game's execution
	//if (wave_tables_made != TRUE)
	//{
		MakeWaveTables();
	//	wave_tables_made = TRUE;
	//}

	memset(envelopeTable, 0, sizeof(envelopeTable));

	i = 0;

	dEnvelope = ptp->initial;
	while (i < ptp->pointAx)
	{
		envelopeTable[i] = (signed char)dEnvelope;
		dEnvelope = (((double)ptp->pointAy - ptp->initial) / ptp->pointAx) + dEnvelope;
		++i;
	}

	dEnvelope = ptp->pointAy;
	while (i < ptp->pointBx)
	{
		envelopeTable[i] = (signed char)dEnvelope;
		dEnvelope = (((double)ptp->pointBy - ptp->pointAy) / (double)(ptp->pointBx - ptp->pointAx)) + dEnvelope;
		++i;
	}

	dEnvelope = ptp->pointBy;
	while (i < ptp->pointCx)
	{
		envelopeTable[i] = (signed char)dEnvelope;
		dEnvelope = ((double)ptp->pointCy - ptp->pointBy) / (double)(ptp->pointCx - ptp->pointBx) + dEnvelope;
		++i;
	}

	dEnvelope = ptp->pointCy;
	while (i < 0x100)
	{
		envelopeTable[i] = (signed char)dEnvelope;
		dEnvelope = dEnvelope - (ptp->pointCy / (double)(0x100 - ptp->pointCx));
		++i;
	}

	dPitch = ptp->oPitch.offset;
	dMain = ptp->oMain.offset;
	dVolume = ptp->oVolume.offset;

	if (ptp->oMain.num == 0.0)
		d1 = 0.0;
	else
		d1 = 256.0 / (ptp->size / ptp->oMain.num);

	if (ptp->oPitch.num == 0.0)
		d2 = 0.0;
	else
		d2 = 256.0 / (ptp->size / ptp->oPitch.num);

	if (ptp->oVolume.num == 0.0)
		d3 = 0.0;
	else
		d3 = 256.0 / (ptp->size / ptp->oVolume.num);

	for (i = 0; i < ptp->size; ++i)
	{
		a = (int)dMain % 0x100;
		b = (int)dPitch % 0x100;
		c = (int)dVolume % 0x100;
		d = (int)((double)(i * 0x100) / ptp->size);
		pData[i] = gWaveModelTable[ptp->oMain.model][a]
		         * ptp->oMain.top
		         / 64
		         * (((gWaveModelTable[ptp->oVolume.model][c] * ptp->oVolume.top) / 64) + 64)
		         / 64
		         * envelopeTable[d]
		         / 64
		         + 128;

		if (gWaveModelTable[ptp->oPitch.model][b] < 0)
			dMain = d1 - d1 * 0.5 * -gWaveModelTable[ptp->oPitch.model][b] * ptp->oPitch.top / 64.0 / 64.0 + dMain;
		else
			dMain = d1 + d1 * 2.0 * gWaveModelTable[ptp->oPitch.model][b] * ptp->oPitch.top / 64.0 / 64.0 + dMain;

		dPitch = dPitch + d2;
		dVolume = dVolume + d3;
	}

	return TRUE;
}